

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmenc.cc
# Opt level: O0

int write_webm_file_footer(WebmOutputContext *webm_ctx)

{
  long *plVar1;
  void *pvVar2;
  bool bVar3;
  long in_RDI;
  bool ok;
  Segment *segment;
  MkvWriter *writer;
  Segment *in_stack_00000030;
  Segment *in_stack_00000088;
  int local_4;
  
  if ((*(long *)(in_RDI + 0x18) == 0) || (*(long *)(in_RDI + 0x20) == 0)) {
    fprintf(_stderr,"webmenc> segment or writer NULL.\n");
    local_4 = -1;
  }
  else {
    plVar1 = *(long **)(in_RDI + 0x18);
    pvVar2 = *(void **)(in_RDI + 0x20);
    bVar3 = mkvmuxer::Segment::Finalize(in_stack_00000088);
    if (pvVar2 != (void *)0x0) {
      mkvmuxer::Segment::~Segment(in_stack_00000030);
      operator_delete(pvVar2);
    }
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x30))();
    }
    *(undefined8 *)(in_RDI + 0x18) = 0;
    *(undefined8 *)(in_RDI + 0x20) = 0;
    if (bVar3) {
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"webmenc> Segment::Finalize failed.\n");
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int write_webm_file_footer(struct WebmOutputContext *webm_ctx) {
  if (!webm_ctx->writer || !webm_ctx->segment) {
    fprintf(stderr, "webmenc> segment or writer NULL.\n");
    return -1;
  }
  mkvmuxer::MkvWriter *const writer =
      reinterpret_cast<mkvmuxer::MkvWriter *>(webm_ctx->writer);
  mkvmuxer::Segment *const segment =
      reinterpret_cast<mkvmuxer::Segment *>(webm_ctx->segment);
  const bool ok = segment->Finalize();
  delete segment;
  delete writer;
  webm_ctx->writer = NULL;
  webm_ctx->segment = NULL;

  if (!ok) {
    fprintf(stderr, "webmenc> Segment::Finalize failed.\n");
    return -1;
  }

  return 0;
}